

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

enable_if_t<std::is_pointer<const_MessageLite_*>::value,_absl::lts_20250127::hash_internal::MixingHashState>
 absl::lts_20250127::hash_internal::
 AbslHashValue<absl::lts_20250127::hash_internal::MixingHashState,google::protobuf::MessageLite_const*>
           (MixingHashState hash_state,MessageLite *ptr)

{
  MixingHashState MVar1;
  MessageLite *local_28;
  uintptr_t v;
  MessageLite *ptr_local;
  MixingHashState hash_state_local;
  
  local_28 = ptr;
  v = (uintptr_t)ptr;
  ptr_local = (MessageLite *)hash_state.state_;
  MVar1 = HashStateBase<absl::lts_20250127::hash_internal::MixingHashState>::
          combine<unsigned_long,unsigned_long>
                    (hash_state,(unsigned_long *)&local_28,(unsigned_long *)&local_28);
  return (enable_if_t<std::is_pointer<const_MessageLite_*>::value,_absl::lts_20250127::hash_internal::MixingHashState>
          )MVar1.state_;
}

Assistant:

std::enable_if_t<std::is_pointer<T>::value, H> AbslHashValue(H hash_state,
                                                             T ptr) {
  auto v = reinterpret_cast<uintptr_t>(ptr);
  // Due to alignment, pointers tend to have low bits as zero, and the next few
  // bits follow a pattern since they are also multiples of some base value. The
  // byte swap in WeakMix helps ensure we still have good entropy in low bits.
  // Mix pointers twice to ensure we have good entropy in low bits.
  return H::combine(std::move(hash_state), v, v);
}